

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzerResults.cpp
# Opt level: O1

void BitFieldToDescAll(BitFieldDesc *bfld,U64 val,
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *desc)

{
  char *pcVar1;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(desc);
  pcVar1 = bfld->bit_name;
  if (pcVar1 != (char *)0x0) {
    do {
      std::__cxx11::string::string((string *)&local_50,pcVar1,&local_51);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)desc,&local_50
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      std::__cxx11::string::append
                ((char *)((desc->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish + -1));
      std::__cxx11::string::append
                ((char *)((desc->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish + -1));
      pcVar1 = bfld[1].bit_name;
      bfld = bfld + 1;
    } while (pcVar1 != (char *)0x0);
  }
  return;
}

Assistant:

void BitFieldToDescAll( const BitFieldDesc* bfld, U64 val, std::vector<std::string>& desc )
{
    desc.clear();

    while( bfld->bit_name )
    {
        desc.push_back( bfld->bit_name );
        desc.back() += "=";

        if( val & U16( 1 << bfld->bit_number ) )
            desc.back() += "1";
        else
            desc.back() += "0";

        ++bfld;
    }
}